

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::FinalizeObjects(LargeHeapBlock *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  LargeObjectHeader *this_00;
  undefined4 *puVar4;
  void *address;
  char *address_00;
  LargeObjectHeader *header;
  uint i;
  HeapBlockMap *heapBlockMap;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  header._4_4_ = 0;
  do {
    if (this->lastCollectAllocCount <= header._4_4_) {
      return;
    }
    this_00 = GetHeaderByIndex(this,header._4_4_);
    if (this_00 != (LargeObjectHeader *)0x0) {
      if (this_00->objectIndex != header._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x797,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      address = LargeObjectHeader::GetAddress(this_00);
      bVar2 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address);
      if ((!bVar2) &&
         (bVar3 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie),
         (bVar3 & 0x80) == 0x80)) {
        address_00 = (char *)LargeObjectHeader::GetAddress(this_00);
        Recycler::NotifyFree(recycler,address_00,this_00->objectSize);
        FinalizeObject(this,recycler,this_00);
      }
    }
    header._4_4_ = header._4_4_ + 1;
  } while( true );
}

Assistant:

void LargeHeapBlock::FinalizeObjects(Recycler* recycler)
{
    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;

    for (uint i = 0; i < this->lastCollectAllocCount; i++)
    {
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
            continue;
        }

        Assert(header->objectIndex == i);

        // Skip finalization if the object is alive
        if (heapBlockMap.IsMarked(header->GetAddress()))
        {
            continue;
        }

        if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) == FinalizeBit)
        {
            recycler->NotifyFree((char *)header->GetAddress(), header->objectSize);
            FinalizeObject(recycler, header);
        }
    }
}